

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_analyze.cpp
# Opt level: O2

void __thiscall
front::syntax::SyntaxAnalyze::hp_gn_binary_mir
          (SyntaxAnalyze *this,string *tmpName,SharedExNdPtr *first,SharedExNdPtr *second,Op op)

{
  element_type *peVar1;
  RightVal op2;
  RightVal op1;
  _Variadic_union<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  undefined1 local_c8;
  _Variadic_union<int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  undefined1 local_a0;
  _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  
  local_c0._M_first._M_storage = (_Uninitialized<int,_true>)0;
  local_a0 = 0;
  local_e8._M_first._M_storage = (_Uninitialized<int,_true>)0;
  local_c8 = 0;
  peVar1 = (first->super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  if (peVar1->_type == CNS) {
    std::variant<int,int,std::__cxx11::string>::emplace<0ul,int&>
              ((variant<int,int,std::__cxx11::string> *)&local_c0._M_first,&peVar1->_value);
  }
  else {
    std::variant<int,int,std::__cxx11::string>::operator=
              ((variant<int,int,std::__cxx11::string> *)&local_c0._M_first,&peVar1->_name);
  }
  peVar1 = (second->super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  if (peVar1->_type == CNS) {
    std::variant<int,int,std::__cxx11::string>::emplace<0ul,int&>
              ((variant<int,int,std::__cxx11::string> *)&local_e8._M_first,&peVar1->_value);
  }
  else {
    std::variant<int,int,std::__cxx11::string>::operator=
              ((variant<int,int,std::__cxx11::string> *)&local_e8._M_first,&peVar1->_name);
  }
  std::__detail::__variant::_Variant_storage<false,int,std::__cxx11::string>::
  _Variant_storage<1ul,std::__cxx11::string&>
            ((_Variant_storage<false,int,std::__cxx11::string> *)&local_48,tmpName);
  std::__detail::__variant::
  _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_70,
                    (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_c0._M_first);
  std::__detail::__variant::
  _Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_Copy_ctor_base((_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_98,
                    (_Copy_ctor_base<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_e8._M_first);
  irGenerator::irGenerator::ir_op
            (&this->irGenerator,(LeftVal *)&local_48,(RightVal *)&local_70,(RightVal *)&local_98,op)
  ;
  std::__detail::__variant::
  _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Variant_storage(&local_98);
  std::__detail::__variant::
  _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Variant_storage(&local_70);
  std::__detail::__variant::
  _Variant_storage<false,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Variant_storage(&local_48);
  std::__detail::__variant::
  _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Variant_storage((_Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_e8._M_first);
  std::__detail::__variant::
  _Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~_Variant_storage((_Variant_storage<false,_int,_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_c0._M_first);
  return;
}

Assistant:

void SyntaxAnalyze::hp_gn_binary_mir(string tmpName, SharedExNdPtr first,
                                     SharedExNdPtr second, Op op) {
  RightVal op1;
  RightVal op2;

  if (first->_type == NodeType::CNS) {
    op1.emplace<0>(first->_value);
  } else {
    op1 = first->_name;
  }
  if (second->_type == NodeType::CNS) {
    op2.emplace<0>(second->_value);
  } else {
    op2 = second->_name;
  }
  irGenerator.ir_op(tmpName, op1, op2, op);
}